

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

void extraProfileUpdateTopLevel(st__table *tNodeTopRef,int TopLevelNew,DdNode *node)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  int *pTopLevel;
  char **local_18;
  
  local_18 = (char **)CONCAT44(in_register_00000004,in_EAX);
  iVar1 = st__find_or_add(tNodeTopRef,(char *)node,&local_18);
  if ((iVar1 == 0) || (TopLevelNew < *(int *)local_18)) {
    *(int *)local_18 = TopLevelNew;
  }
  return;
}

Assistant:

void extraProfileUpdateTopLevel( st__table * tNodeTopRef, int TopLevelNew, DdNode * node )
{
    int * pTopLevel;

    if ( st__find_or_add( tNodeTopRef, (char*)node, (char***)&pTopLevel ) )
    { // the node is already referenced
        // the current top level should be updated if it is larger than the new level
        if ( *pTopLevel > TopLevelNew ) 
             *pTopLevel = TopLevelNew;
    }
    else
    { // the node is not referenced
        // its level should be set to the current new level
        *pTopLevel = TopLevelNew;
    }
}